

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,REF_INT faceid)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  REF_INT RVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  REF_STATUS RVar9;
  REF_LIST pRVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  REF_INT face_nodes [4];
  REF_BOOL reversed;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT seg_nodes [3];
  uint local_84;
  int local_80;
  REF_INT local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  long local_68;
  REF_BOOL local_5c;
  int local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  uint local_44;
  REF_GRID local_40;
  long local_38;
  
  pRVar10 = ref_cavity->tri_list;
  uVar4 = ref_cavity->node;
  local_7c = faceid;
  if (0 < pRVar10->n) {
    local_40 = ref_cavity->ref_grid;
    ref_cell = local_40->cell[8];
    lVar12 = 0;
    local_44 = ref_cavity->node;
    do {
      pRVar1 = local_40->cell[3]->c2n;
      lVar11 = (long)local_40->cell[3]->size_per * (long)pRVar10->value[lVar12];
      local_78 = pRVar1[lVar11];
      local_74 = pRVar1[lVar11 + 1];
      local_70 = pRVar1[lVar11 + 2];
      local_6c = local_78;
      uVar4 = ref_cell_with_face(ref_cell,(REF_INT *)&local_78,&local_54,&local_58);
      if (uVar4 != 0) {
        pcVar15 = "tet";
        uVar13 = 0x3fa;
LAB_0012fa01:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar13,"ref_cavity_form_insert2_tet",(ulong)uVar4,pcVar15);
        return uVar4;
      }
      if (local_54 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3fb,"ref_cavity_form_insert2_tet","tet0 not found");
        return 1;
      }
      if ((long)local_58 != -1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3fc,"ref_cavity_form_insert2_tet","tet1 found",0xffffffffffffffff,(long)local_58);
        return 1;
      }
      uVar4 = ref_cavity_add_tet_without_faceid(ref_cavity,local_54,local_7c);
      uVar6 = local_74;
      uVar8 = local_78;
      if (uVar4 != 0) {
        pcVar15 = "add interior tet face";
        uVar13 = 0x3fe;
        goto LAB_0012fa01;
      }
      uVar14 = (ulong)local_78;
      local_50 = local_78;
      local_4c = local_74;
      local_38 = lVar12;
      uVar4 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_50,&local_80,&local_5c);
      if ((uVar4 != 0) && (uVar4 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x403,"ref_cavity_form_insert2_tet",(ulong)uVar4,"find existing");
        local_84 = uVar4;
      }
      if ((uVar4 != 5) && (uVar4 != 0)) {
        return local_84;
      }
      if (((-1 < (int)uVar8 && local_80 == -1) &&
          (pRVar2 = ref_cell->ref_adj, (int)uVar8 < pRVar2->nnode)) &&
         (lVar12 = (long)pRVar2->first[uVar14], lVar12 != -1)) {
        pRVar3 = pRVar2->item + lVar12;
        RVar5 = ref_cell->node_per;
        while( true ) {
          local_68 = lVar12;
          if (0 < RVar5) {
            iVar7 = pRVar3->ref;
            lVar12 = 0;
            do {
              if (uVar6 == ref_cell->c2n[(long)ref_cell->size_per * (long)iVar7 + lVar12]) {
                uVar4 = ref_cavity_add_tet_without_faceid(ref_cavity,iVar7,local_7c);
                if (uVar4 != 0) {
                  uVar13 = 0x408;
                  goto LAB_0012f8f8;
                }
                RVar5 = ref_cell->node_per;
              }
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < RVar5);
          }
          pRVar3 = ref_cell->ref_adj->item;
          lVar12 = (long)pRVar3[(int)local_68].next;
          if (lVar12 == -1) break;
          pRVar3 = pRVar3 + lVar12;
        }
      }
      uVar8 = local_70;
      uVar4 = local_74;
      uVar14 = (ulong)local_74;
      local_50 = local_74;
      local_4c = local_70;
      uVar6 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_50,&local_80,&local_5c);
      if ((uVar6 != 0) && (uVar6 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x40f,"ref_cavity_form_insert2_tet",(ulong)uVar6,"find existing");
        local_84 = uVar6;
      }
      if ((uVar6 != 5) && (uVar6 != 0)) {
        return local_84;
      }
      if ((((local_80 == -1) && (-1 < (int)uVar4)) &&
          (pRVar2 = ref_cell->ref_adj, (int)uVar4 < pRVar2->nnode)) &&
         (lVar12 = (long)pRVar2->first[uVar14], lVar12 != -1)) {
        pRVar3 = pRVar2->item + lVar12;
        RVar5 = ref_cell->node_per;
        while( true ) {
          local_68 = lVar12;
          if (0 < RVar5) {
            iVar7 = pRVar3->ref;
            lVar12 = 0;
            do {
              if (uVar8 == ref_cell->c2n[(long)ref_cell->size_per * (long)iVar7 + lVar12]) {
                uVar4 = ref_cavity_add_tet_without_faceid(ref_cavity,iVar7,local_7c);
                if (uVar4 != 0) {
                  uVar13 = 0x414;
                  goto LAB_0012f8f8;
                }
                RVar5 = ref_cell->node_per;
              }
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < RVar5);
          }
          pRVar3 = ref_cell->ref_adj->item;
          lVar12 = (long)pRVar3[(int)local_68].next;
          if (lVar12 == -1) break;
          pRVar3 = pRVar3 + lVar12;
        }
      }
      uVar4 = local_70;
      uVar8 = local_78;
      uVar14 = (ulong)local_70;
      local_50 = local_70;
      local_4c = local_78;
      uVar6 = ref_cavity_find_seg(ref_cavity,(REF_INT *)&local_50,&local_80,&local_5c);
      if ((uVar6 != 0) && (uVar6 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x41b,"ref_cavity_form_insert2_tet",(ulong)uVar6,"find existing");
        local_84 = uVar6;
      }
      if ((uVar6 != 5) && (uVar6 != 0)) {
        return local_84;
      }
      if ((((local_80 == -1) && (-1 < (int)uVar4)) &&
          (pRVar2 = ref_cell->ref_adj, (int)uVar4 < pRVar2->nnode)) &&
         (lVar12 = (long)pRVar2->first[uVar14], lVar12 != -1)) {
        pRVar3 = pRVar2->item + lVar12;
        RVar5 = ref_cell->node_per;
        do {
          local_68 = lVar12;
          if (0 < RVar5) {
            iVar7 = pRVar3->ref;
            lVar12 = 0;
            do {
              if (uVar8 == ref_cell->c2n[(long)ref_cell->size_per * (long)iVar7 + lVar12]) {
                uVar4 = ref_cavity_add_tet_without_faceid(ref_cavity,iVar7,local_7c);
                if (uVar4 != 0) {
                  uVar13 = 0x420;
LAB_0012f8f8:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,uVar13,"ref_cavity_form_insert2_tet",(ulong)uVar4,"add interior tet face")
                  ;
                  return uVar4;
                }
                RVar5 = ref_cell->node_per;
              }
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < RVar5);
          }
          pRVar3 = ref_cell->ref_adj->item;
          lVar12 = (long)pRVar3[(int)local_68].next;
          if (lVar12 == -1) break;
          pRVar3 = pRVar3 + lVar12;
        } while( true );
      }
      lVar12 = local_38 + 1;
      pRVar10 = ref_cavity->tri_list;
      uVar4 = local_44;
    } while (lVar12 < pRVar10->n);
  }
  iVar7 = ref_cavity->maxseg;
  if (0 < iVar7) {
    lVar11 = 4;
    lVar12 = 0;
    do {
      uVar8 = *(uint *)((long)ref_cavity->s2n + lVar11 + -4);
      if (uVar8 != 0xffffffff) {
        local_74 = *(uint *)((long)ref_cavity->s2n + lVar11);
        local_78 = uVar8;
        local_70 = uVar4;
        uVar8 = ref_cavity_insert_face(ref_cavity,(REF_INT *)&local_78);
        if (uVar8 != 0) {
          pcVar15 = "tet side";
          uVar13 = 0x429;
          uVar14 = (ulong)uVar8;
          goto LAB_0012f931;
        }
        iVar7 = ref_cavity->maxseg;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar12 < iVar7);
  }
  if ((ref_cavity->debug != 0) &&
     (ref_cavity_tec(ref_cavity,"form-tet.tec"), ref_cavity->debug != 0)) {
    printf("insert face form state %d\n",(ulong)ref_cavity->state);
  }
  RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
  if (RVar9 == 0) {
    if (ref_cavity->debug == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
    }
  }
  else {
    pcVar15 = "ball face manifold";
    uVar8 = 1;
    uVar13 = 0x430;
    uVar14 = 1;
LAB_0012f931:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar13
           ,"ref_cavity_form_insert2_tet",uVar14,pcVar15);
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,
                                               REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_CELL ref_cell;
  REF_INT item;
  REF_INT face_nodes[4], seg_nodes[3], seg;
  /* add tets off wall from seg */
  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    REF_INT tet0, tet1, tet, cell_item, cell_node;
    REF_INT tri;
    REF_BOOL reversed;
    tri = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    face_nodes[0] = ref_cell_c2n(ref_grid_tri(ref_grid), 0, tri);
    face_nodes[1] = ref_cell_c2n(ref_grid_tri(ref_grid), 1, tri);
    face_nodes[2] = ref_cell_c2n(ref_grid_tri(ref_grid), 2, tri);
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(ref_cell, face_nodes, &tet0, &tet1), "tet");
    RUS(REF_EMPTY, tet0, "tet0 not found");
    REIS(REF_EMPTY, tet1, "tet1 found");
    RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet0, faceid),
        "add interior tet face");

    seg_nodes[0] = face_nodes[0];
    seg_nodes[1] = face_nodes[1];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[1];
    seg_nodes[1] = face_nodes[2];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[2];
    seg_nodes[1] = face_nodes[0];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }
  }

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    face_nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    face_nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    face_nodes[2] = node;
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tet.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert face form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}